

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dims_dynamic_extent.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  int local_f4;
  size_t local_f0;
  int local_e4;
  size_t local_e0;
  int local_d4;
  size_t local_d0;
  size_t local_c8;
  int local_bc;
  size_t local_b8;
  int local_ac;
  size_t local_a8;
  int local_9c;
  size_t local_98;
  size_t local_90;
  int local_84;
  size_t local_80;
  size_t local_78;
  int local_6c;
  size_t local_68;
  int local_5c;
  size_t local_58;
  int local_4c;
  size_t local_48;
  int local_3c;
  size_t local_38;
  int local_2c;
  size_t local_28;
  int local_1c;
  size_t local_18;
  undefined4 local_c;
  
  local_c = 0;
  local_18 = std::experimental::detail::dynamic_extent<int>(0);
  local_1c = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(0))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x14,"int main()",&local_18,&local_1c);
  local_28 = std::experimental::detail::dynamic_extent<int>(1);
  local_2c = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(1))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x15,"int main()",&local_28,&local_2c);
  local_38 = std::experimental::detail::dynamic_extent<int>(2);
  local_3c = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(2))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x16,"int main()",&local_38,&local_3c);
  local_48 = std::experimental::detail::dynamic_extent<int,int>(0,3);
  local_4c = 3;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(0, 3))","3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x18,"int main()",&local_48,&local_4c);
  local_58 = std::experimental::detail::dynamic_extent<int,int>(1,3);
  local_5c = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(1, 3))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x19,"int main()",&local_58,&local_5c);
  local_68 = std::experimental::detail::dynamic_extent<int,int>(0,0);
  local_6c = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(0, 0))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x1b,"int main()",&local_68,&local_6c);
  local_78 = std::experimental::detail::dynamic_extent<int,int>(0,0);
  boost::detail::test_ne_impl<unsigned_long,unsigned_long>
            ("(dynamic_extent(0, 0))","dyn",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x1c,"int main()",&local_78,&std::experimental::dyn);
  local_80 = std::experimental::detail::dynamic_extent<int,int>(1,0);
  local_84 = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(1, 0))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x1d,"int main()",&local_80,&local_84);
  local_90 = std::experimental::detail::dynamic_extent<int,int>(1,0);
  boost::detail::test_ne_impl<unsigned_long,unsigned_long>
            ("(dynamic_extent(1, 0))","dyn",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x1e,"int main()",&local_90,&std::experimental::dyn);
  local_98 = std::experimental::detail::dynamic_extent<int,int,int>(0,3,5);
  local_9c = 3;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(0, 3, 5))","3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x20,"int main()",&local_98,&local_9c);
  local_a8 = std::experimental::detail::dynamic_extent<int,int,int>(1,3,5);
  local_ac = 5;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(1, 3, 5))","5",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x21,"int main()",&local_a8,&local_ac);
  local_b8 = std::experimental::detail::dynamic_extent<int,int,int>(2,3,5);
  local_bc = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(2, 3, 5))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x22,"int main()",&local_b8,&local_bc);
  local_c8 = std::experimental::detail::dynamic_extent<int,unsigned_long,int>
                       (0,0xffffffffffffffff,5);
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(dynamic_extent(0, dyn, 5))","dyn",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x24,"int main()",&local_c8,&std::experimental::dyn);
  local_d0 = std::experimental::detail::dynamic_extent<int,unsigned_long,int>
                       (0,0xffffffffffffffff,5);
  local_d4 = 0;
  boost::detail::test_ne_impl<unsigned_long,int>
            ("(dynamic_extent(0, dyn, 5))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x25,"int main()",&local_d0,&local_d4);
  local_e0 = std::experimental::detail::dynamic_extent<int,unsigned_long,int>
                       (1,0xffffffffffffffff,5);
  local_e4 = 5;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(1, dyn, 5))","5",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x26,"int main()",&local_e0,&local_e4);
  local_f0 = std::experimental::detail::dynamic_extent<int,unsigned_long,int>
                       (2,0xffffffffffffffff,5);
  local_f4 = 0;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(dynamic_extent(2, dyn, 5))","0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_dims_dynamic_extent.cpp"
             ,0x27,"int main()",&local_f0,&local_f4);
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    BOOST_TEST_EQ((dynamic_extent(0)), 0);
    BOOST_TEST_EQ((dynamic_extent(1)), 0);
    BOOST_TEST_EQ((dynamic_extent(2)), 0);
    
    BOOST_TEST_EQ((dynamic_extent(0, 3)), 3);
    BOOST_TEST_EQ((dynamic_extent(1, 3)), 0);

    BOOST_TEST_EQ((dynamic_extent(0, 0)), 0);
    BOOST_TEST_NE((dynamic_extent(0, 0)), dyn);
    BOOST_TEST_EQ((dynamic_extent(1, 0)), 0);
    BOOST_TEST_NE((dynamic_extent(1, 0)), dyn);
    
    BOOST_TEST_EQ((dynamic_extent(0, 3, 5)), 3);
    BOOST_TEST_EQ((dynamic_extent(1, 3, 5)), 5);
    BOOST_TEST_EQ((dynamic_extent(2, 3, 5)), 0);

    BOOST_TEST_EQ((dynamic_extent(0, dyn, 5)), dyn);
    BOOST_TEST_NE((dynamic_extent(0, dyn, 5)), 0);
    BOOST_TEST_EQ((dynamic_extent(1, dyn, 5)), 5);
    BOOST_TEST_EQ((dynamic_extent(2, dyn, 5)), 0);

    return boost::report_errors();
}